

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O0

SVector * fizplex::operator*(double c,SVector *vec)

{
  bool bVar1;
  iterator __lhs;
  reference pNVar2;
  SVector *in_RDI;
  double in_XMM0_Qa;
  Nonzero *n;
  iterator __end1;
  iterator __begin1;
  SVector *__range1;
  SVector *result;
  SVector *in_stack_ffffffffffffff88;
  SVector *in_stack_ffffffffffffff90;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_30 [2];
  undefined1 local_19;
  double local_10;
  
  local_19 = 0;
  local_10 = in_XMM0_Qa;
  SVector::SVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_30[0]._M_current = (Nonzero *)SVector::begin(in_stack_ffffffffffffff88);
  __lhs = SVector::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    pNVar2 = __gnu_cxx::
             __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
             ::operator*(local_30);
    pNVar2->value = local_10 * pNVar2->value;
    __gnu_cxx::
    __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
    ::operator++(local_30);
  }
  return in_RDI;
}

Assistant:

SVector operator*(const double c, const SVector &vec) {
  SVector result = vec;
  for (auto &n : result)
    n.value *= c;
  return result;
}